

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

void finddpos(level *lev,coord *cc,xchar xl,xchar yl,xchar xh,xchar yh)

{
  char cVar1;
  char cVar2;
  int iVar3;
  xchar local_40;
  xchar local_38;
  char local_1e;
  char local_1d;
  xchar y;
  xchar x;
  xchar yh_local;
  xchar xh_local;
  xchar yl_local;
  xchar xl_local;
  coord *cc_local;
  level *lev_local;
  
  local_38 = xl;
  if (xl != xh) {
    iVar3 = rn2(((int)xh - (int)xl) + 1);
    local_38 = xl + (char)iVar3;
  }
  local_40 = yl;
  if (yl != yh) {
    iVar3 = rn2(((int)yh - (int)yl) + 1);
    local_40 = yl + (char)iVar3;
  }
  iVar3 = okdoor(lev,local_38,local_40);
  cVar1 = local_40;
  cVar2 = local_38;
  local_1d = xl;
  if (iVar3 == 0) {
    for (; local_1e = yl, cVar1 = xl, local_1d <= xh; local_1d = local_1d + '\x01') {
      for (; local_1e <= yh; local_1e = local_1e + '\x01') {
        iVar3 = okdoor(lev,local_1d,local_1e);
        cVar1 = local_1e;
        cVar2 = local_1d;
        if (iVar3 != 0) goto LAB_002344c0;
      }
    }
    while (local_1d = cVar1, local_1e = yl, cVar1 = yh, cVar2 = xl, local_1d <= xh) {
      for (; local_1e <= yh; local_1e = local_1e + '\x01') {
        cVar1 = local_1e;
        cVar2 = local_1d;
        if ((lev->locations[local_1d][local_1e].typ == '\x17') ||
           (lev->locations[local_1d][local_1e].typ == '\x0f')) goto LAB_002344c0;
      }
      cVar1 = local_1d + '\x01';
    }
  }
LAB_002344c0:
  local_1d = cVar2;
  local_1e = cVar1;
  cc->x = local_1d;
  cc->y = local_1e;
  return;
}

Assistant:

static void finddpos(struct level *lev, coord *cc, xchar xl, xchar yl, xchar xh, xchar yh)
{
	xchar x, y;

	x = (xl == xh) ? xl : (xl + rn2(xh-xl+1));
	y = (yl == yh) ? yl : (yl + rn2(yh-yl+1));
	if (okdoor(lev, x, y))
		goto gotit;

	for (x = xl; x <= xh; x++) for(y = yl; y <= yh; y++)
		if (okdoor(lev, x, y))
			goto gotit;

	for (x = xl; x <= xh; x++) for(y = yl; y <= yh; y++)
		if (IS_DOOR(lev->locations[x][y].typ) || lev->locations[x][y].typ == SDOOR)
			goto gotit;
	/* cannot find something reasonable -- strange */
	x = xl;
	y = yh;
gotit:
	cc->x = x;
	cc->y = y;
	return;
}